

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_spec_constant_default_value_pass.h
# Opt level: O0

void __thiscall
spvtools::opt::SetSpecConstantDefaultValuePass::SetSpecConstantDefaultValuePass
          (SetSpecConstantDefaultValuePass *this,SpecIdToValueStrMap *default_values)

{
  SpecIdToValueStrMap *default_values_local;
  SetSpecConstantDefaultValuePass *this_local;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__SetSpecConstantDefaultValuePass_010e62a8;
  std::
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->spec_id_to_value_str_,default_values);
  memset(&this->spec_id_to_value_bit_pattern_,0,0x38);
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::unordered_map(&this->spec_id_to_value_bit_pattern_);
  return;
}

Assistant:

explicit SetSpecConstantDefaultValuePass(
      const SpecIdToValueStrMap& default_values)
      : spec_id_to_value_str_(default_values),
        spec_id_to_value_bit_pattern_() {}